

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall xray_re::se_smart_cover::state_write(se_smart_cover *this,xr_packet *packet)

{
  pointer plVar1;
  pointer plVar2;
  allocator<char> local_51;
  long *local_50 [2];
  long local_40 [2];
  
  cse_smart_cover::state_write(&this->super_cse_smart_cover,packet);
  if (0x7f < (this->super_cse_smart_cover).super_cse_alife_dynamic_object.super_cse_alife_object.
             super_cse_abstract.m_version) {
    (*packet->_vptr_xr_packet[4])(packet,&this->m_last_description);
    (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_loopholes_count);
    if (this->m_loopholes_count != '\0') {
      plVar2 = (this->m_loopholes->
               super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
               )._M_impl.super__Vector_impl_data._M_start;
      plVar1 = (this->m_loopholes->
               super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (plVar2 != plVar1) {
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_50,plVar2->id,&local_51);
          (*packet->_vptr_xr_packet[4])(packet,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          (*packet->_vptr_xr_packet[0xc])(packet,(ulong)plVar2->enabled);
          plVar2 = plVar2 + 1;
        } while (plVar2 != plVar1);
      }
    }
  }
  return;
}

Assistant:

void se_smart_cover::state_write(xr_packet& packet)
{
	cse_smart_cover::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		packet.w_sz(m_last_description);
		packet.w_u8(m_loopholes_count);

		if (m_loopholes_count > 0)
		{
			for (std::vector<loophole>::iterator it = m_loopholes->begin(), end = m_loopholes->end();
				it != end; ++it){
				packet.w_sz(it->id);
				packet.w_bool(it->enabled);
			}
		}
	}
}